

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opengl_settings.cpp
# Opt level: O1

void update_depth_function(void)

{
  PFNGLDEPTHFUNCPROC *pp_Var1;
  ostream *poVar2;
  GLenum GVar3;
  
  if (enable_depth_buffer) {
    (*glad_glEnable)(0xb71);
    if (7 < (ulong)current_depth_buffer_func) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"unhandled switch case ",0x16);
      poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,0x6c);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/src/misc/opengl_settings.cpp"
                 ,0x65);
      std::endl<char,std::char_traits<char>>(poVar2);
      exit(1);
    }
    GVar3 = *(GLenum *)(&DAT_0068890c + (ulong)current_depth_buffer_func * 4);
    pp_Var1 = &glad_glDepthFunc;
  }
  else {
    GVar3 = 0xb71;
    pp_Var1 = &glad_glDisable;
  }
  (**pp_Var1)(GVar3);
  return;
}

Assistant:

void update_depth_function() noexcept
{
    if (!enable_depth_buffer)
    {
        glDisable(GL_DEPTH_TEST);
        return;
    }

    glEnable(GL_DEPTH_TEST);
    switch (current_depth_buffer_func)
    {
    case DepthFun::ALWAYS:
    {
        glDepthFunc(GL_ALWAYS);
        break;
    };
    case DepthFun::EQUAL:
    {
        glDepthFunc(GL_EQUAL);
        break;
    };
    case DepthFun::GEQUAL:
    {
        glDepthFunc(GL_GEQUAL);
        break;
    };
    case DepthFun::GREATER:
    {
        glDepthFunc(GL_GREATER);
        break;
    };
    case DepthFun::LEQUAL:
    {
        glDepthFunc(GL_LEQUAL);
        break;
    };
    case DepthFun::LESS:
    {
        glDepthFunc(GL_LESS);
        break;
    };
    case DepthFun::NEVER:
    {
        glDepthFunc(GL_NEVER);
        break;
    };
    case DepthFun::NOTEQUAL:
    {
        glDepthFunc(GL_NOTEQUAL);
        break;
    };
    default:
    {
        UNHANDLED_SWITCH_CASE(__LINE__, __FILE__);
    };
    }
}